

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSet::spanUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint8_t *s0;
  uint uVar8;
  ulong uVar9;
  uint length_00;
  uint uVar10;
  ulong uVar11;
  UnicodeSetStringSpan strSpan;
  
  iVar2 = (int32_t)&strSpan;
  sVar4 = (size_t)(uint)length;
  if (length < 1) {
    if (-1 < length) {
      return 0;
    }
    sVar4 = strlen(s);
    if ((int)sVar4 == 0) {
      return 0;
    }
  }
  else if (this->bmpSet != (BMPSet *)0x0) {
    puVar3 = BMPSet::spanUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    return (int)puVar3 - (int)s;
  }
  length_00 = (uint)sVar4;
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
    iVar2 = UnicodeSetStringSpan::spanUTF8(this->stringSpan,(uint8_t *)s,length_00,spanCondition);
    return iVar2;
  }
  if (this->strings->count != 0) {
    UnicodeSetStringSpan::UnicodeSetStringSpan
              (&strSpan,this,this->strings,0x26 - (spanCondition == USET_SPAN_NOT_CONTAINED));
    if (strSpan.maxLength8 != 0) {
      iVar2 = UnicodeSetStringSpan::spanUTF8(&strSpan,(uint8_t *)s,length_00,spanCondition);
    }
    UnicodeSetStringSpan::~UnicodeSetStringSpan(&strSpan);
    if (strSpan.maxLength8 != 0) {
      return iVar2;
    }
  }
  uVar9 = 0;
  do {
    lVar5 = (long)(int)uVar9;
    uVar11 = lVar5 + 1;
    bVar7 = s[lVar5];
    uVar8 = (uint)bVar7;
    if ((char)bVar7 < '\0') {
      if ((uint)uVar11 == length_00) {
LAB_002a991d:
        uVar8 = 0xfffd;
        uVar11 = sVar4 & 0xffffffff;
      }
      else {
        if (bVar7 < 0xe0) {
          if (0xc1 < bVar7) {
            uVar8 = bVar7 & 0x1f;
LAB_002a9977:
            if ((byte)((byte)s[(int)uVar11] ^ 0x80) < 0x40) {
              uVar8 = uVar8 << 6 | (byte)s[(int)uVar11] ^ 0x80;
              uVar11 = (ulong)((int)uVar11 + 1);
              goto LAB_002a99e8;
            }
          }
        }
        else if (bVar7 < 0xf0) {
          uVar8 = bVar7 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar8] >> ((byte)s[uVar11] >> 5) & 1) != 0) {
            bVar7 = s[uVar11] & 0x3f;
LAB_002a995a:
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            if (uVar10 != length_00) {
              uVar8 = (uint)bVar7 | uVar8 << 6;
              goto LAB_002a9977;
            }
            goto LAB_002a991d;
          }
        }
        else if (bVar7 < 0xf5) {
          if (((uint)(int)""[(byte)s[uVar11] >> 4] >> (uVar8 - 0xf0 & 0x1f) & 1) != 0) {
            uVar6 = lVar5 + 2;
            if ((uint)uVar6 == length_00) goto LAB_002a991d;
            bVar7 = s[uVar6] + 0x80;
            if (0x3f < bVar7) {
              uVar8 = 0xfffd;
              uVar11 = uVar6 & 0xffffffff;
              goto LAB_002a99e8;
            }
            uVar8 = (byte)s[uVar11] & 0x3f | (uVar8 - 0xf0) * 0x40;
            uVar11 = uVar6 & 0xffffffff;
            goto LAB_002a995a;
          }
        }
        uVar8 = 0xfffd;
      }
    }
LAB_002a99e8:
    UVar1 = contains(this,uVar8);
    if ((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) != (int)UVar1) {
      return (int)uVar9;
    }
    uVar9 = uVar11 & 0xffffffff;
    if ((int)length_00 <= (int)uVar11) {
      return (int)uVar11;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSet::spanUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return (int32_t)(bmpSet->spanUTF8(s0, length, spanCondition)-s0);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::FWD_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::FWD_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t start=0, prev=0;
    do {
        U8_NEXT_OR_FFFD(s, start, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=start)<length);
    return prev;
}